

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::CombinedUniformLimitCase::iterate
          (CombinedUniformLimitCase *this)

{
  ulong uVar1;
  TestLog *pTVar2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  int iVar6;
  undefined4 extraout_var;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  undefined8 uVar10;
  ScopedLogSection section;
  CallLogWrapper gl;
  StateQueryMemoryWriteGuard<int> maxUniformComponents;
  StateQueryMemoryWriteGuard<int> maxUniformBlockSize;
  StateQueryMemoryWriteGuard<int> maxUniformBlocks;
  ResultCollector result;
  Enum<int,_2UL> local_2d0;
  TestLog local_2c0;
  long lStack_2b8;
  string local_2b0;
  Enum<int,_2UL> local_290;
  ulong local_280 [2];
  string local_270;
  CallLogWrapper local_250;
  StateQueryMemoryWriteGuard<int> local_234;
  StateQueryMemoryWriteGuard<int> local_228;
  StateQueryMemoryWriteGuard<int> local_21c;
  ResultCollector local_210;
  code *local_1c0;
  GLenum local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_250,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_210,pTVar2,(string *)local_1b0);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  local_250.m_enableLog = true;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"The minimum value of ",0x15);
  local_2b0._M_dataplus._M_p = (pointer)glu::getGettableStateName;
  local_2b0._M_string_length = CONCAT44(local_2b0._M_string_length._4_4_,this->m_combined);
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_2b0,(ostream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," is ",4);
  local_2d0.m_getName = glu::getGettableStateName;
  local_2d0.m_value = this->m_numBlocks;
  tcu::Format::Enum<int,_2UL>::toStream(&local_2d0,(ostream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8," x MAX_UNIFORM_BLOCK_SIZE / 4 + ",0x20);
  local_290.m_value = this->m_defaultComponents;
  local_290.m_getName = glu::getGettableStateName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_290,(ostream *)&local_1a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_21c.m_preguard = -0x21212122;
  local_21c.m_value = -0x21212122;
  local_21c.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv(&local_250,this->m_numBlocks,&local_21c.m_value);
  GVar5 = glu::CallLogWrapper::glGetError(&local_250);
  if (GVar5 != 0) {
    local_290.m_getName = (GetNameFunc)local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_1c0 = glu::getErrorName;
    local_1b8 = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_1c0);
    uVar1 = local_270._M_string_length + CONCAT44(local_290._12_4_,local_290.m_value);
    uVar9 = 0xf;
    if (local_290.m_getName != (GetNameFunc)local_280) {
      uVar9 = local_280[0];
    }
    if (uVar9 < uVar1) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        uVar10 = local_270.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < uVar1) goto LAB_013ed273;
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_270,0,(char *)0x0,(ulong)local_290.m_getName);
    }
    else {
LAB_013ed273:
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_290,(ulong)local_270._M_dataplus._M_p);
    }
    local_2d0.m_getName = (GetNameFunc)&local_2c0;
    pTVar2 = (TestLog *)(plVar7 + 2);
    if ((TestLog *)*plVar7 == pTVar2) {
      local_2c0.m_log = pTVar2->m_log;
      lStack_2b8 = plVar7[3];
    }
    else {
      local_2c0.m_log = pTVar2->m_log;
      local_2d0.m_getName = (GetNameFunc)*plVar7;
    }
    local_2d0._8_8_ = plVar7[1];
    *plVar7 = (long)pTVar2;
    plVar7[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar8) {
      local_2b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = plVar7[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_2b0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2b0._M_string_length = plVar7[1];
    *plVar7 = (long)paVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar8) {
      local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1a0[0]._8_8_ = plVar7[3];
      local_1b0 = (undefined1  [8])local_1a0;
    }
    else {
      local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1b0 = (undefined1  [8])*plVar7;
    }
    local_1a8 = (_func_int **)plVar7[1];
    *plVar7 = (long)paVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(&local_210,(string *)local_1b0);
    if (local_1b0 != (undefined1  [8])local_1a0) {
      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_2d0.m_getName != &local_2c0) {
      operator_delete(local_2d0.m_getName,(ulong)((long)&(local_2c0.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if (local_290.m_getName != (GetNameFunc)local_280) {
      operator_delete(local_290.m_getName,local_280[0] + 1);
    }
  }
  local_228.m_preguard = -0x21212122;
  local_228.m_value = -0x21212122;
  local_228.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv(&local_250,0x8a30,&local_228.m_value);
  GVar5 = glu::CallLogWrapper::glGetError(&local_250);
  if (GVar5 != 0) {
    local_290.m_getName = (GetNameFunc)local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_1c0 = glu::getErrorName;
    local_1b8 = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_1c0);
    uVar1 = local_270._M_string_length + CONCAT44(local_290._12_4_,local_290.m_value);
    uVar9 = 0xf;
    if (local_290.m_getName != (GetNameFunc)local_280) {
      uVar9 = local_280[0];
    }
    if (uVar9 < uVar1) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        uVar10 = local_270.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < uVar1) goto LAB_013ed4de;
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_270,0,(char *)0x0,(ulong)local_290.m_getName);
    }
    else {
LAB_013ed4de:
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_290,(ulong)local_270._M_dataplus._M_p);
    }
    local_2d0.m_getName = (GetNameFunc)&local_2c0;
    pTVar2 = (TestLog *)(plVar7 + 2);
    if ((TestLog *)*plVar7 == pTVar2) {
      local_2c0.m_log = pTVar2->m_log;
      lStack_2b8 = plVar7[3];
    }
    else {
      local_2c0.m_log = pTVar2->m_log;
      local_2d0.m_getName = (GetNameFunc)*plVar7;
    }
    local_2d0._8_8_ = plVar7[1];
    *plVar7 = (long)pTVar2;
    plVar7[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar8) {
      local_2b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = plVar7[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_2b0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2b0._M_string_length = plVar7[1];
    *plVar7 = (long)paVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar8) {
      local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1a0[0]._8_8_ = plVar7[3];
      local_1b0 = (undefined1  [8])local_1a0;
    }
    else {
      local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1b0 = (undefined1  [8])*plVar7;
    }
    local_1a8 = (_func_int **)plVar7[1];
    *plVar7 = (long)paVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(&local_210,(string *)local_1b0);
    if (local_1b0 != (undefined1  [8])local_1a0) {
      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_2d0.m_getName != &local_2c0) {
      operator_delete(local_2d0.m_getName,(ulong)((long)&(local_2c0.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if (local_290.m_getName != (GetNameFunc)local_280) {
      operator_delete(local_290.m_getName,local_280[0] + 1);
    }
  }
  local_234.m_preguard = -0x21212122;
  local_234.m_value = -0x21212122;
  local_234.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv(&local_250,this->m_defaultComponents,&local_234.m_value);
  GVar5 = glu::CallLogWrapper::glGetError(&local_250);
  if (GVar5 == 0) goto LAB_013ed8f3;
  local_290.m_getName = (GetNameFunc)local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
  local_1c0 = glu::getErrorName;
  local_1b8 = GVar5;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_1c0);
  uVar1 = local_270._M_string_length + CONCAT44(local_290._12_4_,local_290.m_value);
  uVar9 = 0xf;
  if (local_290.m_getName != (GetNameFunc)local_280) {
    uVar9 = local_280[0];
  }
  if (uVar9 < uVar1) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar10 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < uVar1) goto LAB_013ed749;
    plVar7 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_270,0,(char *)0x0,(ulong)local_290.m_getName);
  }
  else {
LAB_013ed749:
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_290,(ulong)local_270._M_dataplus._M_p);
  }
  local_2d0.m_getName = (GetNameFunc)&local_2c0;
  pTVar2 = (TestLog *)(plVar7 + 2);
  if ((TestLog *)*plVar7 == pTVar2) {
    local_2c0.m_log = pTVar2->m_log;
    lStack_2b8 = plVar7[3];
  }
  else {
    local_2c0.m_log = pTVar2->m_log;
    local_2d0.m_getName = (GetNameFunc)*plVar7;
  }
  local_2d0._8_8_ = plVar7[1];
  *plVar7 = (long)pTVar2;
  plVar7[1] = 0;
  *(undefined1 *)&pTVar2->m_log = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar8) {
    local_2b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = plVar7[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_2b0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2b0._M_string_length = plVar7[1];
  *plVar7 = (long)paVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar8) {
    local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_1a0[0]._8_8_ = plVar7[3];
    local_1b0 = (undefined1  [8])local_1a0;
  }
  else {
    local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_1b0 = (undefined1  [8])*plVar7;
  }
  local_1a8 = (_func_int **)plVar7[1];
  *plVar7 = (long)paVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  tcu::ResultCollector::fail(&local_210,(string *)local_1b0);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_2d0.m_getName != &local_2c0) {
    operator_delete(local_2d0.m_getName,(ulong)((long)&(local_2c0.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if (local_290.m_getName != (GetNameFunc)local_280) {
    operator_delete(local_290.m_getName,local_280[0] + 1);
  }
LAB_013ed8f3:
  bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_21c,&local_210);
  if (bVar3) {
    bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                      (&local_228,&local_210);
    if (bVar3) {
      bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                        (&local_234,&local_210);
      if (bVar3) {
        iVar6 = local_228.m_value * local_21c.m_value;
        iVar4 = iVar6 + 3;
        if (-1 < iVar6) {
          iVar4 = iVar6;
        }
        iVar4 = (iVar4 >> 2) + local_234.m_value;
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  (&local_210,&local_250,this->m_combined,iVar4,QUERY_INTEGER);
        pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        local_1b0 = (undefined1  [8])local_1a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Types","");
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b0,"Alternative queries","");
        tcu::ScopedLogSection::ScopedLogSection
                  ((ScopedLogSection *)&local_2d0,pTVar2,(string *)local_1b0,&local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if (local_1b0 != (undefined1  [8])local_1a0) {
          operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
        }
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  (&local_210,&local_250,this->m_combined,iVar4,QUERY_BOOLEAN);
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  (&local_210,&local_250,this->m_combined,iVar4,QUERY_INTEGER64);
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  (&local_210,&local_250,this->m_combined,iVar4,QUERY_FLOAT);
        tcu::TestLog::endSection((TestLog *)local_2d0.m_getName);
      }
    }
  }
  tcu::ResultCollector::setTestContextResult
            (&local_210,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_prefix._M_dataplus._M_p != &local_210.m_prefix.field_2) {
    operator_delete(local_210.m_prefix._M_dataplus._M_p,
                    local_210.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_250);
  return STOP;
}

Assistant:

CombinedUniformLimitCase::IterateResult CombinedUniformLimitCase::iterate (void)
{
	checkTessellationSupport(m_context);

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "The minimum value of " << glu::getGettableStateStr(m_combined)
						<< " is " << glu::getGettableStateStr(m_numBlocks)
						<< " x MAX_UNIFORM_BLOCK_SIZE / 4 + "
						<< glu::getGettableStateStr(m_defaultComponents)
						<< tcu::TestLog::EndMessage;

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlocks;
	gl.glGetIntegerv(m_numBlocks, &maxUniformBlocks);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlockSize;
	gl.glGetIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &maxUniformBlockSize);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformComponents;
	gl.glGetIntegerv(m_defaultComponents, &maxUniformComponents);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	if (maxUniformBlocks.verifyValidity(result) && maxUniformBlockSize.verifyValidity(result) && maxUniformComponents.verifyValidity(result))
	{
		const int limit = ((int)maxUniformBlocks) * ((int)maxUniformBlockSize) / 4 + (int)maxUniformComponents;
		verifyStateIntegerMin(result, gl, m_combined, limit, QUERY_INTEGER);

		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
			verifyStateIntegerMin(result, gl, m_combined, limit, QUERY_BOOLEAN);
			verifyStateIntegerMin(result, gl, m_combined, limit, QUERY_INTEGER64);
			verifyStateIntegerMin(result, gl, m_combined, limit, QUERY_FLOAT);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}